

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::~JUnitTestOutput(JUnitTestOutput *this)

{
  JUnitTestOutputImpl *in_RDI;
  JUnitTestOutput *in_stack_00000030;
  size_t sVar1;
  
  (in_RDI->results_).testCount_ = (size_t)&PTR__JUnitTestOutput_001c3598;
  resetTestGroupResult(in_stack_00000030);
  sVar1 = (in_RDI->results_).groupExecTime_;
  if (sVar1 != 0) {
    JUnitTestOutputImpl::~JUnitTestOutputImpl(in_RDI);
    operator_delete(in_RDI,sVar1);
  }
  TestOutput::~TestOutput((TestOutput *)in_RDI);
  return;
}

Assistant:

JUnitTestOutput::~JUnitTestOutput()
{
    resetTestGroupResult();
    delete impl_;
}